

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O0

void __thiscall t_py_generator::generate_enum(t_py_generator *this,t_enum *tenum)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *__x;
  reference pptVar4;
  string *psVar5;
  char *pcVar6;
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8;
  string local_4b8;
  string local_498 [32];
  string local_478;
  string local_458;
  string local_438 [32];
  string local_418;
  string local_3f8;
  int local_3d4;
  iterator iStack_3d0;
  int value;
  t_enum_value **local_3c8;
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_3c0;
  iterator c_iter;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  string local_380;
  byte local_35b;
  allocator local_35a;
  byte local_359;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  undefined1 local_308 [8];
  ostringstream from_string_mapping;
  ostringstream to_string_mapping;
  t_enum *tenum_local;
  t_py_generator *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&from_string_mapping.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
  poVar3 = std::operator<<((ostream *)&this->f_types_,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"class ");
  iVar2 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
  pcVar6 = "";
  if ((this->gen_newstyle_ & 1U) != 0) {
    pcVar6 = "(object)";
  }
  poVar3 = std::operator<<(poVar3,pcVar6);
  local_359 = 0;
  local_35b = 0;
  if ((this->gen_dynamic_ & 1U) == 0) {
    std::allocator<char>::allocator();
    local_35b = 1;
    std::__cxx11::string::string((string *)&local_338,"",&local_35a);
  }
  else {
    std::operator+(&local_358,"(",&this->gen_dynbaseclass_);
    local_359 = 1;
    std::operator+(&local_338,&local_358,")");
  }
  poVar3 = std::operator<<(poVar3,(string *)&local_338);
  poVar3 = std::operator<<(poVar3,":");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_338);
  if ((local_35b & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_35a);
  }
  if ((local_359 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_358);
  }
  t_generator::indent_up(&this->super_t_generator);
  generate_python_docstring(this,(ostream *)&this->f_types_,(t_doc *)tenum);
  t_generator::indent_abi_cxx11_(&local_380,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&from_string_mapping.field_0x170,(string *)&local_380);
  poVar3 = std::operator<<(poVar3,"_VALUES_TO_NAMES = {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_380);
  t_generator::indent_abi_cxx11_
            ((string *)
             &constants.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)local_308,
                           (string *)
                           &constants.
                            super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar3 = std::operator<<(poVar3,"_NAMES_TO_VALUES = {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string
            ((string *)
             &constants.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  __x = t_enum::get_constants(tenum);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  ::__normal_iterator(&local_3c0);
  local_3c8 = (t_enum_value **)
              std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::begin
                        ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
  local_3c0._M_current = local_3c8;
  while( true ) {
    iStack_3d0 = std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::end
                           ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
    bVar1 = __gnu_cxx::operator!=(&local_3c0,&stack0xfffffffffffffc30);
    if (!bVar1) break;
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_3c0);
    local_3d4 = t_enum_value::get_value(*pptVar4);
    poVar3 = t_generator::indent(&this->super_t_generator,(ostream *)&this->f_types_);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_3c0);
    psVar5 = t_enum_value::get_name_abi_cxx11_(*pptVar4);
    poVar3 = std::operator<<(poVar3,(string *)psVar5);
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3d4);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_3f8,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)&from_string_mapping.field_0x170,(string *)&local_3f8);
    t_generator::indent_abi_cxx11_(&local_418,&this->super_t_generator);
    poVar3 = std::operator<<(poVar3,(string *)&local_418);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3d4);
    poVar3 = std::operator<<(poVar3,": \"");
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_3c0);
    psVar5 = t_enum_value::get_name_abi_cxx11_(*pptVar4);
    (*(this->super_t_generator)._vptr_t_generator[3])(local_438,this,psVar5);
    poVar3 = std::operator<<(poVar3,local_438);
    poVar3 = std::operator<<(poVar3,"\",");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string(local_438);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_3f8);
    t_generator::indent_abi_cxx11_(&local_458,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)local_308,(string *)&local_458);
    t_generator::indent_abi_cxx11_(&local_478,&this->super_t_generator);
    poVar3 = std::operator<<(poVar3,(string *)&local_478);
    poVar3 = std::operator<<(poVar3,'\"');
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_3c0);
    psVar5 = t_enum_value::get_name_abi_cxx11_(*pptVar4);
    (*(this->super_t_generator)._vptr_t_generator[3])(local_498,this,psVar5);
    poVar3 = std::operator<<(poVar3,local_498);
    poVar3 = std::operator<<(poVar3,"\": ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3d4);
    poVar3 = std::operator<<(poVar3,',');
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string(local_498);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_458);
    __gnu_cxx::
    __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
    ::operator++(&local_3c0);
  }
  t_generator::indent_abi_cxx11_(&local_4b8,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&from_string_mapping.field_0x170,(string *)&local_4b8);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_4b8);
  t_generator::indent_abi_cxx11_(&local_4d8,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)local_308,(string *)&local_4d8);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_4d8);
  t_generator::indent_down(&this->super_t_generator);
  std::operator<<((ostream *)&this->f_types_,(string *)&::endl_abi_cxx11_);
  std::__cxx11::ostringstream::str();
  poVar3 = std::operator<<((ostream *)&this->f_types_,local_4f8);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::ostringstream::str();
  std::operator<<(poVar3,local_518);
  std::__cxx11::string::~string(local_518);
  std::__cxx11::string::~string(local_4f8);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::~vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&from_string_mapping.field_0x170);
  return;
}

Assistant:

void t_py_generator::generate_enum(t_enum* tenum) {
  std::ostringstream to_string_mapping, from_string_mapping;

  f_types_ << endl << endl << "class " << tenum->get_name() << (gen_newstyle_ ? "(object)" : "")
           << (gen_dynamic_ ? "(" + gen_dynbaseclass_ + ")" : "") << ":" << endl;
  indent_up();
  generate_python_docstring(f_types_, tenum);

  to_string_mapping << indent() << "_VALUES_TO_NAMES = {" << endl;
  from_string_mapping << indent() << "_NAMES_TO_VALUES = {" << endl;

  vector<t_enum_value*> constants = tenum->get_constants();
  vector<t_enum_value*>::iterator c_iter;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    int value = (*c_iter)->get_value();
    indent(f_types_) << (*c_iter)->get_name() << " = " << value << endl;

    // Dictionaries to/from string names of enums
    to_string_mapping << indent() << indent() << value << ": \""
                      << escape_string((*c_iter)->get_name()) << "\"," << endl;
    from_string_mapping << indent() << indent() << '"' << escape_string((*c_iter)->get_name())
                        << "\": " << value << ',' << endl;
  }
  to_string_mapping << indent() << "}" << endl;
  from_string_mapping << indent() << "}" << endl;

  indent_down();
  f_types_ << endl;
  f_types_ << to_string_mapping.str() << endl << from_string_mapping.str();
}